

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupStrashReduce(Gia_Man_t *p,Vec_Wec_t *vSupps,Vec_Int_t **pvCoMap)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar7;
  bool bVar8;
  Vec_Int_t *vMap;
  Vec_Int_t *vCoMapRes;
  int nSuppMax;
  int iLit;
  int iCi;
  int k;
  int i;
  Vec_Int_t *vCoMapLit;
  Vec_Int_t *vSuppOne;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Obj_t *pObj;
  Vec_Int_t **pvCoMap_local;
  Vec_Wec_t *vSupps_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xfe5,"Gia_Man_t *Gia_ManDupStrashReduce(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t **)"
                 );
  }
  Gia_ManFillValue(p);
  iVar1 = Gia_ManCoNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar4;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  iVar1 = Gia_ManCoSuppSizeMax(p,vSupps);
  for (iCi = 0; iCi < iVar1; iCi = iCi + 1) {
    Gia_ManAppendCi(p_01);
  }
  Gia_ManHashAlloc(p_01);
  iCi = 0;
  do {
    iVar1 = Vec_IntSize(p->vCos);
    bVar8 = false;
    if (iCi < iVar1) {
      pNew = (Gia_Man_t *)Gia_ManCo(p,iCi);
      bVar8 = pNew != (Gia_Man_t *)0x0;
    }
    if (!bVar8) {
      Gia_ManHashStop(p_01);
      iVar1 = Vec_IntSize(p_00);
      iVar3 = Gia_ManCoNum(p);
      if (iVar1 == iVar3) {
        if (pvCoMap == (Vec_Int_t **)0x0) {
          for (iCi = 0; iVar1 = Vec_IntSize(p_00), iCi < iVar1; iCi = iCi + 1) {
            iVar1 = Vec_IntEntry(p_00,iCi);
            Gia_ManAppendCo(p_01,iVar1);
          }
        }
        else {
          iVar1 = Gia_ManCoNum(p);
          pVVar6 = Vec_IntAlloc(iVar1);
          iVar1 = Gia_ManObjNum(p_01);
          p_02 = Vec_IntStartFull(iVar1 << 1);
          for (iCi = 0; iVar1 = Vec_IntSize(p_00), iCi < iVar1; iCi = iCi + 1) {
            iVar1 = Vec_IntEntry(p_00,iCi);
            iVar3 = Vec_IntEntry(p_02,iVar1);
            if (iVar3 == -1) {
              iVar3 = Gia_ManCoNum(p_01);
              Vec_IntWriteEntry(p_02,iVar1,iVar3);
              Gia_ManAppendCo(p_01,iVar1);
            }
            iVar1 = Vec_IntEntry(p_02,iVar1);
            Vec_IntPush(pVVar6,iVar1);
          }
          Vec_IntFree(p_02);
          *pvCoMap = pVVar6;
        }
        Vec_IntFree(p_00);
        pGVar7 = Gia_ManCleanup(p_01);
        Gia_ManStop(p_01);
        return pGVar7;
      }
      __assert_fail("Vec_IntSize(vCoMapLit) == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                    ,0x1002,
                    "Gia_Man_t *Gia_ManDupStrashReduce(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t **)");
    }
    pVVar6 = Vec_WecEntry(vSupps,iCi);
    iVar1 = Vec_IntSize(pVVar6);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninC0((Gia_Obj_t *)pNew);
      iVar1 = Abc_Var2Lit(0,iVar1);
      Vec_IntPush(p_00,iVar1);
    }
    else {
      iVar1 = Vec_IntSize(pVVar6);
      if (iVar1 == 1) {
        iVar1 = Gia_ObjFaninC0((Gia_Obj_t *)pNew);
        iVar1 = Abc_Var2Lit(1,iVar1);
        Vec_IntPush(p_00,iVar1);
      }
      else {
        for (iLit = 0; iVar1 = Vec_IntSize(pVVar6), iLit < iVar1; iLit = iLit + 1) {
          iVar1 = Vec_IntEntry(pVVar6,iLit);
          pGVar5 = Gia_ManCi(p_01,iLit);
          uVar2 = Gia_Obj2Lit(p_01,pGVar5);
          pGVar5 = Gia_ManCi(p,iVar1);
          pGVar5->Value = uVar2;
        }
        pGVar5 = Gia_ObjFanin0((Gia_Obj_t *)pNew);
        Gia_ManDupHashDfs_rec(p_01,p,pGVar5);
        iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pNew);
        iVar3 = Gia_ManObjNum(p_01);
        if (SBORROW4(iVar1,iVar3 * 2) == iVar1 + iVar3 * -2 < 0) {
          __assert_fail("Gia_ObjFanin0Copy(pObj) < 2 * Gia_ManObjNum(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                        ,0xffc,
                        "Gia_Man_t *Gia_ManDupStrashReduce(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t **)")
          ;
        }
        iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pNew);
        Vec_IntPush(p_00,iVar1);
        pGVar5 = Gia_ObjFanin0((Gia_Obj_t *)pNew);
        Gia_ManDupCleanDfs_rec(pGVar5);
      }
    }
    iCi = iCi + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupStrashReduce( Gia_Man_t * p, Vec_Wec_t * vSupps, Vec_Int_t ** pvCoMap )
{
    Gia_Obj_t * pObj;
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vSuppOne, * vCoMapLit;
    int i, k, iCi, iLit, nSuppMax;
    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManFillValue( p );
    vCoMapLit = Vec_IntAlloc( Gia_ManCoNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    nSuppMax = Gia_ManCoSuppSizeMax( p, vSupps );
    for ( i = 0; i < nSuppMax; i++ )
        Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
    {
        vSuppOne = Vec_WecEntry( vSupps, i );
        if ( Vec_IntSize(vSuppOne) == 0 )
            Vec_IntPush( vCoMapLit, Abc_Var2Lit(0, Gia_ObjFaninC0(pObj)) );
        else if ( Vec_IntSize(vSuppOne) == 1 )
            Vec_IntPush( vCoMapLit, Abc_Var2Lit(1, Gia_ObjFaninC0(pObj)) );
        else
        {
            Vec_IntForEachEntry( vSuppOne, iCi, k )
                Gia_ManCi(p, iCi)->Value = Gia_Obj2Lit(pNew, Gia_ManCi(pNew, k) );
            Gia_ManDupHashDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
            assert( Gia_ObjFanin0Copy(pObj) < 2 * Gia_ManObjNum(pNew) );
            Vec_IntPush( vCoMapLit, Gia_ObjFanin0Copy(pObj) );
            Gia_ManDupCleanDfs_rec( Gia_ObjFanin0(pObj) );
        }
    }
    Gia_ManHashStop( pNew );
    assert( Vec_IntSize(vCoMapLit) == Gia_ManCoNum(p) );
    if ( pvCoMap == NULL ) // do not remap
    {
        Vec_IntForEachEntry( vCoMapLit, iLit, i )
            Gia_ManAppendCo( pNew, iLit );
    }
    else // remap
    {
        Vec_Int_t * vCoMapRes = Vec_IntAlloc( Gia_ManCoNum(p) );      // map old CO into new CO 
        Vec_Int_t * vMap = Vec_IntStartFull( 2*Gia_ManObjNum(pNew) ); // map new lit into new CO
        Vec_IntForEachEntry( vCoMapLit, iLit, i )
        {
            if ( Vec_IntEntry(vMap, iLit) == -1 )
            {
                Vec_IntWriteEntry( vMap, iLit, Gia_ManCoNum(pNew) );
                Gia_ManAppendCo( pNew, iLit );
            }
            Vec_IntPush( vCoMapRes, Vec_IntEntry(vMap, iLit) );
        }
        Vec_IntFree( vMap );
        *pvCoMap = vCoMapRes;
    }
    Vec_IntFree( vCoMapLit );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}